

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans.c
# Opt level: O3

float64 k_means_label_subset
                  (codew_t *label,vector_t *mean,uint32 n_mean,uint32 *subset,uint32 n_obs_subset,
                  uint32 veclen)

{
  bool bVar1;
  vector_t pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float64 fVar7;
  double dVar8;
  double dVar9;
  
  if (n_obs_subset == 0) {
    fVar7 = 0.0;
  }
  else {
    uVar4 = 0;
    fVar7 = 0.0;
    uVar5 = 0;
    do {
      pfVar2 = (*get_obs)(subset[uVar4]);
      if (n_mean == 0) {
        dVar8 = 1e+300;
      }
      else {
        uVar3 = 0;
        dVar8 = 1e+300;
        do {
          dVar9 = 0.0;
          bVar1 = 0.0 < dVar8;
          if ((veclen != 0) && (0.0 < dVar8)) {
            uVar6 = 1;
            do {
              dVar9 = (double)(mean[uVar3][uVar6 - 1] - pfVar2[uVar6 - 1]) *
                      (double)(mean[uVar3][uVar6 - 1] - pfVar2[uVar6 - 1]) + dVar9;
              bVar1 = dVar9 < dVar8;
              if (veclen <= uVar6) break;
              uVar6 = uVar6 + 1;
            } while (dVar9 < dVar8);
          }
          if (bVar1) {
            uVar5 = uVar3 & 0xffffffff;
            dVar8 = dVar9;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != n_mean);
      }
      fVar7 = (float64)((double)fVar7 + dVar8);
      label[uVar4] = (codew_t)uVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != n_obs_subset);
  }
  return fVar7;
}

Assistant:

float64
k_means_label_subset(codew_t *label,
		     vector_t *mean,
		     uint32 n_mean,       /* # of mean vectors */
		     uint32 *subset,
		     uint32 n_obs_subset,   /* in # of vectors */
		     uint32 veclen)
{
    uint32 i, j, b_j=0, l;
    float64 t, d;
    float64 b_d;
    float64 sqerr;
    vector_t c;
    vector_t m;

    for (i = 0, sqerr = 0; i < n_obs_subset; i++) {
	b_d = 1e300;

	c = get_obs(subset[i]);
	
	for (j = 0; j < n_mean; j++) {
	    m = mean[j];

	    for (l = 0, d = 0.0; (l < veclen) && (d < b_d); l++) {
		t = m[l] - c[l];
		d += t * t;
	    }

	    if (d < b_d) {
		b_d = d;
		b_j = j;
	    }
	}

	label[i] = b_j;

	sqerr += b_d;
    }

    return sqerr;
}